

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_geometry_device.cpp
# Opt level: O3

void embree::addPoints(RTCScene scene,RTCGeometryType gtype,Vec3fa *pos)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar17;
  float fVar18;
  undefined1 auVar16 [16];
  
  uVar3 = rtcNewGeometry(g_device);
  lVar7 = 0;
  lVar4 = rtcSetNewGeometryBuffer(uVar3,1,0,0x9004,0x10,0x200);
  uVar6 = 0x3e33aef8;
  uVar8 = 0x30000000;
  uVar9 = 0x40800000;
  do {
    uVar2 = *(undefined8 *)((long)&pos->field_0 + 4);
    pfVar1 = (float *)(lVar4 + lVar7);
    *pfVar1 = (pos->field_0).m128[0] +
              (float)(uVar6 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10 * 4.0 + -2.0;
    pfVar1[1] = (float)uVar2 +
                (float)(uVar6 * 0x17385ca9 + 0x47502932 >> 1) * 4.656613e-10 * 4.0 + -2.0;
    pfVar1[2] = (float)((ulong)uVar2 >> 0x20) +
                (float)(uVar6 * -0x50b6f56b + 0xd1ccf6e9 >> 1) * 4.656613e-10 * 4.0 + -2.0;
    pfVar1[3] = (float)(uVar6 * 0x979e791 + 0xaaf95334 >> 1) * 4.656613e-10 * 0.13 + 0.02 + 0.0;
    auVar12._0_4_ = (float)(uVar6 * -0x556277a3 + 0x6252e503 >> 1) * 4.656613e-10;
    auVar12._4_4_ = (float)(uVar6 * -0x40960547 + 0x9f2ec686 >> 1) * 4.656613e-10;
    uVar6 = uVar6 * 0x6e587165 + 0x57fe6c2d;
    auVar12._8_4_ = (float)(uVar6 >> 1) * 4.656613e-10;
    auVar12._12_4_ = 0;
    *(undefined1 (*) [16])(DAT_002c9d38 + lVar7) = auVar12;
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x2000);
  if (gtype == RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT) {
    lVar7 = 0;
    lVar4 = rtcSetNewGeometryBuffer(uVar3,3,0,0x9003,0x10,0x200);
    uVar8 = 0xbf800000;
    uVar9 = 0xbf800000;
    do {
      iVar5 = uVar6 * 0x17385ca9;
      fVar10 = (float)(uVar6 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
      uVar6 = uVar6 * -0x50b6f56b + 0xd1ccf6e9;
      fVar10 = fVar10 + fVar10 + -1.0;
      fVar13 = (float)(iVar5 + 0x47502932U >> 1) * 4.656613e-10;
      fVar17 = (float)(uVar6 >> 1) * 4.656613e-10;
      fVar14 = fVar13 + fVar13 + -1.0;
      fVar18 = fVar17 + fVar17 + -1.0;
      fVar13 = fVar14 * fVar14;
      fVar17 = fVar18 * fVar18;
      fVar15 = fVar13 + fVar10 * fVar10 + fVar17;
      auVar16._0_8_ = CONCAT44(fVar13 + fVar13 + 0.0,fVar15);
      auVar16._8_4_ = fVar13 + fVar17 + fVar17;
      auVar16._12_4_ = fVar13 + 0.0 + 0.0;
      auVar11._8_4_ = auVar16._8_4_;
      auVar11._0_8_ = auVar16._0_8_;
      auVar11._12_4_ = auVar16._12_4_;
      auVar12 = rsqrtss(auVar11,auVar16);
      fVar13 = auVar12._0_4_;
      fVar13 = fVar13 * fVar13 * fVar15 * -0.5 * fVar13 + fVar13 * 1.5;
      pfVar1 = (float *)(lVar4 + lVar7);
      *pfVar1 = fVar13 * fVar10;
      pfVar1[1] = fVar13 * fVar14;
      pfVar1[2] = fVar13 * fVar18;
      pfVar1[3] = fVar13 * 0.0;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x2000);
  }
  rtcCommitGeometry(uVar8,uVar9,uVar3);
  rtcAttachGeometry(scene,uVar3);
  rtcReleaseGeometry(uVar3);
  return;
}

Assistant:

void addPoints (RTCScene scene, RTCGeometryType gtype, const Vec3fa& pos)
{
  RandomSampler rng;
  RandomSampler_init(rng, 42);

#define COORD RandomSampler_get1D(rng) * 4.f - 2.f
#define RADIUS RandomSampler_get1D(rng) * 0.13f + 0.02f
#define COLOR RandomSampler_get1D(rng)
#define NORMAL RandomSampler_get1D(rng) * 2.f - 1.f

  RTCGeometry geom = rtcNewGeometry (g_device, gtype);
  Vec4f* point_vertices = (Vec4f*)rtcSetNewGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT4, sizeof(Vec4f), NUM_POINTS);

  for (int i = 0; i < NUM_POINTS; i++)
  {
    const float vx = COORD;
    const float vy = COORD;
    const float vz = COORD;
    const float vr = RADIUS;
    point_vertices[i] = Vec4f(pos.x,pos.y,pos.z,0.0f) + Vec4f(vx, vy, vz, vr);
    const float cr = COLOR;
    const float cg = COLOR;
    const float cb = COLOR;
    data.point_colors[i] = Vec3fa(cr,cg,cb);
  }

  if (gtype == RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT) {
    Vec3fa* point_normals = (Vec3fa*)rtcSetNewGeometryBuffer(geom,RTC_BUFFER_TYPE_NORMAL, 0, RTC_FORMAT_FLOAT3, sizeof(Vec3fa), NUM_POINTS);
    for (int i = 0; i < NUM_POINTS; i++) {
      const float nx = NORMAL;
      const float ny = NORMAL;
      const float nz = NORMAL;
      point_normals[i] = Vec3fa(nx,ny,nz);
      point_normals[i] = normalize(point_normals[i]);
    }
  }

  rtcCommitGeometry(geom);
  rtcAttachGeometry(scene,geom);
  rtcReleaseGeometry(geom);
}